

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O1

void TestConstExpr::ConstExprTest(void)

{
  ConstTestT<char>();
  ComparisonTestT<char>();
  ConstCastTestT<char>();
  ConstTestT<signed_char>();
  ComparisonTestT<signed_char>();
  ConstCastTestT<signed_char>();
  ConstTestT<unsigned_char>();
  ComparisonTestT<unsigned_char>();
  ConstCastTestT<unsigned_char>();
  ConstTestT<short>();
  ComparisonTestT<short>();
  ConstCastTestT<short>();
  ConstTestT<unsigned_short>();
  ComparisonTestT<unsigned_short>();
  ConstCastTestT<unsigned_short>();
  ConstTestT<int>();
  ComparisonTestT<int>();
  ConstCastTestT<int>();
  ConstTestT<unsigned_int>();
  ComparisonTestT<unsigned_int>();
  ConstCastTestT<unsigned_int>();
  ConstTestT<long>();
  ComparisonTestT<long>();
  ConstCastTestT<long>();
  ConstTestT<unsigned_long>();
  ComparisonTestT<unsigned_long>();
  ConstCastTestT<unsigned_long>();
  ConstTestT<long_long>();
  ComparisonTestT<long_long>();
  ConstCastTestT<long_long>();
  ConstTestT<unsigned_long_long>();
  ComparisonTestT<unsigned_long_long>();
  ConstCastTestT<unsigned_long_long>();
  if (ConstExprTest()::pt == '\0') {
    ConstExprTest();
  }
  return;
}

Assistant:

void ConstExprTest()
	{
		ConstExprTestT<char>();
		ConstExprTestT<signed char>();
		ConstExprTestT<unsigned char>();
		ConstExprTestT<signed short>();
		ConstExprTestT<unsigned short>();
		ConstExprTestT<signed int>();
		ConstExprTestT<unsigned int>();
		ConstExprTestT<signed long>();
		ConstExprTestT<unsigned long>();
		ConstExprTestT<signed long long>();
		ConstExprTestT<unsigned long long>();

		// Catch the SafePtrDiff function, since it is marked. Can't think of a scenario for this being constexpr, though.
		const char* p1 = (char*)1;
		const char* p2 = nullptr;

		static const SafeInt<ptrdiff_t> pt = SafePtrDiff(p1, p2);
		if (pt > 0)
			return;
	}